

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_x86_64-inl.h
# Opt level: O1

_Unwind_Reason_Code google::GetOneFrame(_Unwind_Context *uc,void *opq)

{
  int iVar1;
  undefined8 uVar2;
  
  if (*(int *)((long)opq + 0xc) < 1) {
    uVar2 = _Unwind_GetIP();
    iVar1 = *(int *)((long)opq + 0x10);
    *(int *)((long)opq + 0x10) = iVar1 + 1;
    *(undefined8 *)(*opq + (long)iVar1 * 8) = uVar2;
  }
  else {
    *(int *)((long)opq + 0xc) = *(int *)((long)opq + 0xc) + -1;
  }
  return (uint)(*(int *)((long)opq + 0x10) == *(int *)((long)opq + 8)) * 5;
}

Assistant:

static _Unwind_Reason_Code GetOneFrame(struct _Unwind_Context *uc, void *opq) {
  trace_arg_t *targ = (trace_arg_t *) opq;

  if (targ->skip_count > 0) {
    targ->skip_count--;
  } else {
    targ->result[targ->count++] = (void *) _Unwind_GetIP(uc);
  }

  if (targ->count == targ->max_depth)
    return _URC_END_OF_STACK;

  return _URC_NO_REASON;
}